

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O2

long duckdb::ArrayDistanceFun::GetFunctions(void)

{
  NotImplementedException *this;
  long in_RDI;
  long lVar1;
  optional_idx oVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  code *local_3f0 [2];
  code *local_3e0;
  code *local_3d8;
  pointer local_3d0;
  LogicalType local_3c8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_398;
  LogicalType local_380 [24];
  LogicalType array;
  string local_350 [32];
  undefined1 local_330 [296];
  ScalarFunction function;
  allocator_type local_e0 [176];
  
  std::__cxx11::string::string(local_350,"array_distance",(allocator *)&function);
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  std::__cxx11::string::~string(local_350);
  duckdb::LogicalType::Real();
  local_3d0 = local_398.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  oVar2.index = (idx_t)local_398.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  do {
    if ((pointer)oVar2.index == local_3d0) {
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_398);
      return in_RDI;
    }
    duckdb::LogicalType::ARRAY(&array,oVar2);
    if (*(char *)oVar2.index == '\x17') {
      duckdb::LogicalType::LogicalType((LogicalType *)local_330,&array);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),&array);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)local_330;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3b0,__l_00,local_e0);
      duckdb::LogicalType::LogicalType(local_3c8,(LogicalType *)oVar2.index);
      local_3f0[1] = (code *)0x0;
      local_3f0[0] = ArrayGenericFold<double,duckdb::DistanceOp>;
      local_3d8 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_3e0 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      duckdb::LogicalType::LogicalType(local_380,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                (&function,&local_3b0,local_3c8,(_Function_base *)local_3f0,ArrayGenericBinaryBind,0
                 ,0,0,local_380,0,0,0);
      duckdb::LogicalType::~LogicalType(local_380);
      std::_Function_base::~_Function_base((_Function_base *)local_3f0);
      duckdb::LogicalType::~LogicalType(local_3c8);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b0);
      lVar1 = 0x18;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_330 + lVar1));
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != -0x18);
      BaseScalarFunction::SetReturnsError
                ((BaseScalarFunction *)local_e0,&function.super_BaseScalarFunction);
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_e0);
      ScalarFunction::ScalarFunction((ScalarFunction *)local_330,&function);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 (in_RDI + 0x20),(ScalarFunction *)local_330);
    }
    else {
      if (*(char *)oVar2.index != '\x16') {
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&function,"Array function not implemented for type %s",
                   (allocator *)local_e0);
        duckdb::LogicalType::ToString_abi_cxx11_();
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this,(string *)&function,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
        __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
      }
      duckdb::LogicalType::LogicalType((LogicalType *)local_330,&array);
      duckdb::LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),&array);
      __l._M_len = 2;
      __l._M_array = (iterator)local_330;
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3b0,__l,local_e0);
      duckdb::LogicalType::LogicalType(local_3c8,(LogicalType *)oVar2.index);
      local_3f0[1] = (code *)0x0;
      local_3f0[0] = ArrayGenericFold<float,duckdb::DistanceOp>;
      local_3d8 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_3e0 = std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      duckdb::LogicalType::LogicalType(local_380,INVALID);
      duckdb::ScalarFunction::ScalarFunction
                (&function,&local_3b0,local_3c8,(_Function_base *)local_3f0,ArrayGenericBinaryBind,0
                 ,0,0,local_380,0,0,0);
      duckdb::LogicalType::~LogicalType(local_380);
      std::_Function_base::~_Function_base((_Function_base *)local_3f0);
      duckdb::LogicalType::~LogicalType(local_3c8);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b0);
      lVar1 = 0x18;
      do {
        duckdb::LogicalType::~LogicalType((LogicalType *)(local_330 + lVar1));
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != -0x18);
      BaseScalarFunction::SetReturnsError
                ((BaseScalarFunction *)local_e0,&function.super_BaseScalarFunction);
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_e0);
      ScalarFunction::ScalarFunction((ScalarFunction *)local_330,&function);
      std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 (in_RDI + 0x20),(ScalarFunction *)local_330);
    }
    ScalarFunction::~ScalarFunction((ScalarFunction *)local_330);
    ScalarFunction::~ScalarFunction(&function);
    duckdb::LogicalType::~LogicalType(&array);
    oVar2.index = oVar2.index + 0x18;
  } while( true );
}

Assistant:

ScalarFunctionSet ArrayDistanceFun::GetFunctions() {
	ScalarFunctionSet set("array_distance");
	for (auto &type : LogicalType::Real()) {
		AddArrayFoldFunction<DistanceOp>(set, type);
	}
	return set;
}